

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  int *pRc;
  u8 **ppuVar1;
  ushort uVar2;
  Fts5Config *pFVar3;
  u8 *__s2;
  sqlite3_blob *pBlob;
  Fts5SegIter *pFVar4;
  u8 *pTerm;
  byte bVar5;
  int iVar6;
  undefined8 *p_00;
  Fts5Structure *pFVar7;
  undefined8 *puVar8;
  Fts5Iter *pFVar9;
  long lVar10;
  Fts5CResult *pFVar11;
  int iVar12;
  ulong uVar13;
  code *pcVar14;
  long lVar15;
  ulong uVar16;
  Fts5IndexIter **ppFVar17;
  bool bVar18;
  Fts5SegIter *local_b8;
  ulong uStack_b0;
  long local_a0;
  int local_94;
  Fts5IndexIter **local_90;
  Fts5Iter *local_88;
  code *local_80;
  Fts5Buffer local_78;
  size_t local_68;
  code *local_60;
  ulong local_58;
  Fts5Structure *local_50;
  Fts5SegIter *local_48;
  ulong uStack_40;
  Fts5Iter *p1;
  
  pFVar3 = p->pConfig;
  local_88 = (Fts5Iter *)0x0;
  local_78.p = (u8 *)0x0;
  local_78.n = 0;
  local_78.nSpace = 0;
  pRc = &p->rc;
  local_90 = ppIter;
  iVar6 = sqlite3Fts5BufferSize(pRc,&local_78,nToken + 1U);
  if (iVar6 != 0) goto LAB_001ca7c8;
  local_a0 = CONCAT44(local_a0._4_4_,nToken + 1U);
  if (nToken == 0) {
    iVar6 = 0;
    uVar16 = 0;
    if ((flags & 1U) != 0) goto LAB_001ca201;
  }
  else {
    memcpy(local_78.p + 1,pToken,(long)nToken);
    uVar16 = 0;
    if ((flags & 1U) != 0) {
      if (nToken < 1) {
        iVar6 = 0;
      }
      else {
        iVar12 = 0;
        iVar6 = 0;
        do {
          iVar12 = iVar12 + 1;
          iVar6 = iVar6 + 1;
        } while (iVar12 < nToken);
      }
LAB_001ca201:
      if (pFVar3->nPrefix < 1) {
        uVar16 = 1;
      }
      else {
        uVar16 = (ulong)(uint)pFVar3->nPrefix + 1;
        uVar13 = 1;
        do {
          if (pFVar3->aPrefix[uVar13 - 1] == iVar6) {
            uVar16 = uVar13 & 0xffffffff;
            break;
          }
          uVar13 = uVar13 + 1;
        } while (uVar16 != uVar13);
      }
    }
  }
  pTerm = local_78.p;
  if (pFVar3->nPrefix < (int)uVar16) {
    *local_78.p = '0';
    bVar18 = p->pConfig->eDetail == 1;
    pcVar14 = fts5AppendPoslist;
    if (bVar18) {
      pcVar14 = fts5AppendRowid;
    }
    local_80 = fts5MergePrefixLists;
    if (bVar18) {
      local_80 = fts5MergeRowidLists;
    }
    p_00 = (undefined8 *)sqlite3Fts5MallocZero(pRc,0x200);
    pFVar7 = fts5StructureRead(p);
    if (pFVar7 == (Fts5Structure *)0x0 || p_00 == (undefined8 *)0x0) {
      pFVar9 = (Fts5Iter *)0x0;
      ppFVar17 = local_90;
    }
    else {
      p1 = (Fts5Iter *)0x0;
      local_b8 = (Fts5SegIter *)0x0;
      uStack_b0 = 0;
      iVar6 = (int)local_a0;
      local_60 = pcVar14;
      local_58 = (ulong)(uint)nToken;
      local_50 = pFVar7;
      fts5MultiIterNew(p,pFVar7,0x38,pColset,pTerm,(int)local_a0,-1,0,&p1);
      pFVar9 = p1;
      fts5IterSetOutputCb(pRc,p1);
      if ((p->rc == 0) && ((pFVar9->base).bEof == '\0')) {
        local_68 = (size_t)iVar6;
        pFVar11 = pFVar9->aFirst;
        bVar18 = true;
        local_a0 = 0;
        while( true ) {
          uVar2 = pFVar11[1].iFirst;
          iVar6 = pFVar9->aSeg[uVar2].term.n;
          __s2 = pFVar9->aSeg[uVar2].term.p;
          (*pFVar9->xSetOutputs)(pFVar9,pFVar9->aSeg + uVar2);
          if ((bVar18) &&
             ((iVar6 <= (int)local_58 || (iVar6 = bcmp(pTerm,__s2,local_68), iVar6 != 0)))) break;
          if ((pFVar9->base).nData != 0) {
            lVar15 = (pFVar9->base).iRowid;
            lVar10 = local_a0;
            if ((lVar15 <= local_a0) && (0 < (int)uStack_b0)) {
              puVar8 = p_00;
              if (*pRc == 0) {
                do {
                  if (*(int *)(puVar8 + 1) == 0) {
                    local_48 = local_b8;
                    uStack_40 = uStack_b0;
                    pFVar4 = (Fts5SegIter *)*puVar8;
                    uVar16 = puVar8[1];
                    *puVar8 = local_b8;
                    puVar8[1] = uStack_b0;
                    uStack_b0 = uVar16 & 0xffffffff00000000;
                    local_b8 = pFVar4;
                    break;
                  }
                  (*local_80)(p,&local_b8,puVar8);
                  *(undefined4 *)(puVar8 + 1) = 0;
                  if (p->rc != 0) break;
                  puVar8 = puVar8 + 2;
                } while ((int)uStack_b0 != 0);
                lVar15 = (pFVar9->base).iRowid;
                lVar10 = 0;
              }
              else {
                lVar10 = 0;
              }
            }
            (*local_60)(p,lVar15 - lVar10,pFVar9,&local_b8);
            local_a0 = (pFVar9->base).iRowid;
          }
          if (*pRc != 0) break;
          uVar2 = pFVar9->aFirst[1].iFirst;
          bVar18 = false;
          do {
            local_94 = 0;
            (*pFVar9->aSeg[uVar2].xNext)(p,pFVar9->aSeg + uVar2,&local_94);
            if (((pFVar9->aSeg[uVar2].pLeaf == (Fts5Data *)0x0) || (local_94 != 0)) ||
               (iVar6 = fts5MultiIterAdvanceRowid(pFVar9,(uint)uVar2,&local_48), iVar6 != 0)) {
              bVar18 = true;
              fts5MultiIterAdvanced(p,pFVar9,(uint)uVar2,1);
              pFVar11 = pFVar9->aFirst;
              uVar2 = pFVar11[1].iFirst;
              uVar16 = (ulong)uVar2;
              (pFVar9->base).bEof = pFVar9->aSeg[uVar16].pLeaf == (Fts5Data *)0x0;
              pFVar9->iSwitchRowid = pFVar9->aSeg[uVar16].iRowid;
            }
            else {
              pFVar11 = pFVar9->aFirst;
              uVar2 = pFVar11[1].iFirst;
              uVar16 = (ulong)uVar2;
            }
            if (*pRc != 0) goto LAB_001ca321;
          } while ((pFVar9->aSeg[uVar16].pLeaf != (Fts5Data *)0x0) &&
                  (pFVar9->aSeg[uVar16].nPos == 0));
          if ((pFVar9->base).bEof != '\0') break;
        }
      }
LAB_001ca321:
      pcVar14 = local_80;
      lVar15 = 0;
      do {
        if (*pRc == 0) {
          (*pcVar14)(p,&local_b8,(long)p_00 + lVar15);
        }
        sqlite3_free(*(void **)((long)p_00 + lVar15));
        *(undefined8 *)((long)p_00 + lVar15) = 0;
        ((undefined8 *)((long)p_00 + lVar15))[1] = 0;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x200);
      fts5MultiIterFree(pFVar9);
      puVar8 = (undefined8 *)sqlite3Fts5MallocZero(pRc,(long)(int)uStack_b0 + 0x18);
      if (puVar8 == (undefined8 *)0x0) {
        pFVar9 = (Fts5Iter *)0x0;
      }
      else {
        *puVar8 = puVar8 + 2;
        *(int *)((long)puVar8 + 0xc) = (int)uStack_b0;
        *(int *)(puVar8 + 1) = (int)uStack_b0;
        if ((long)(int)uStack_b0 != 0) {
          memcpy(puVar8 + 2,local_b8,(long)(int)uStack_b0);
        }
        pFVar9 = fts5MultiIterAlloc(p,2);
        if (pFVar9 != (Fts5Iter *)0x0) {
          *(undefined4 *)&pFVar9[1].base.pData = 1;
          if (*(int *)((long)puVar8 + 0xc) < 1) {
            (pFVar9->base).bEof = '\x01';
          }
          else {
            *(undefined8 **)&pFVar9[1].base.nData = puVar8;
            bVar5 = sqlite3Fts5GetVarint((uchar *)*puVar8,(u64 *)&pFVar9[1].aSeg[0].flags);
            *(uint *)&pFVar9[1].poslist.p = (uint)bVar5;
            *(undefined4 *)((long)&pFVar9[1].xSetOutputs + 4) = *(undefined4 *)(puVar8 + 1);
            pFVar9->aFirst[1].iFirst = 1;
            if ((flags & 2U) == 0) {
              fts5SegIterLoadNPos(p,(Fts5SegIter *)(pFVar9 + 1));
            }
            else {
              pFVar9->bRev = 1;
              ppuVar1 = &pFVar9[1].base.pData;
              *(byte *)ppuVar1 = *(byte *)ppuVar1 | 2;
              fts5SegIterReverseInitPage(p,(Fts5SegIter *)(pFVar9 + 1));
            }
            puVar8 = (undefined8 *)0x0;
          }
          local_88 = pFVar9;
          if (((ulong)pFVar9[1].base.pData & 2) == 0) {
            if (p->pConfig->eDetail == 1) {
              pcVar14 = fts5SegIterNext_None;
            }
            else {
              pcVar14 = fts5SegIterNext;
            }
            *(code **)&pFVar9[1].poslist.n = pcVar14;
          }
          else {
            *(code **)&pFVar9[1].poslist.n = fts5SegIterNext_Reverse;
          }
        }
        sqlite3_free(puVar8);
        pFVar9 = local_88;
      }
      ppFVar17 = local_90;
      sqlite3_free(local_b8);
      pFVar7 = local_50;
    }
    fts5StructureRelease(pFVar7);
    sqlite3_free(p_00);
    fts5IterSetOutputCb(pRc,pFVar9);
    if (*pRc == 0) {
      uVar2 = pFVar9->aFirst[1].iFirst;
      if (pFVar9->aSeg[uVar2].pLeaf != (Fts5Data *)0x0) {
        (*pFVar9->xSetOutputs)(pFVar9,pFVar9->aSeg + uVar2);
      }
      goto LAB_001ca78f;
    }
LAB_001ca79a:
    sqlite3Fts5IterClose(&pFVar9->base);
    pBlob = p->pReader;
    if (pBlob != (sqlite3_blob *)0x0) {
      p->pReader = (sqlite3_blob *)0x0;
      sqlite3_blob_close(pBlob);
    }
    pFVar9 = (Fts5Iter *)0x0;
  }
  else {
    pFVar7 = fts5StructureRead(p);
    ppFVar17 = local_90;
    *local_78.p = (char)uVar16 + '0';
    if (pFVar7 != (Fts5Structure *)0x0) {
      fts5MultiIterNew(p,pFVar7,flags | 0x10,pColset,local_78.p,(int)local_a0,-1,0,&local_88);
      fts5StructureRelease(pFVar7);
    }
LAB_001ca78f:
    pFVar9 = local_88;
    if (*pRc != 0) goto LAB_001ca79a;
  }
  *ppFVar17 = &pFVar9->base;
  sqlite3_free(local_78.p);
LAB_001ca7c8:
  iVar6 = *pRc;
  *pRc = 0;
  return iVar6;
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    if( nToken ) memcpy(&buf.p[1], pToken, nToken);

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists), 
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug 
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        if( pConfig->aPrefix[iIdx-1]==nChar ) break;
      }
    }

    if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY, 
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      buf.p[0] = FTS5_MAIN_PREFIX;
      fts5SetupPrefixIter(p, bDesc, buf.p, nToken+1, pColset, &pRet);
      assert( p->rc!=SQLITE_OK || pRet->pColset==0 );
      fts5IterSetOutputCb(&p->rc, pRet);
      if( p->rc==SQLITE_OK ){
        Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
        if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
      }
    }

    if( p->rc ){
      sqlite3Fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5CloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}